

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_performOptIRStable
          (SoPlexBase<double> *this,SolRational *sol,bool acceptUnbounded,bool acceptInfeasible,
          int minIRRoundsRemaining,bool *primalFeasible,bool *dualFeasible,bool *infeasible,
          bool *unbounded,bool *stoppedTime,bool *stoppedIter,bool *error)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *vec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pVVar1;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *o;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *this_00;
  Verbosity VVar2;
  int iVar3;
  VarStatus *pVVar4;
  Statistics *pSVar5;
  SPxLPRational *pSVar6;
  _func_int **pp_Var7;
  pointer pnVar8;
  pointer __s;
  pointer pdVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  bool bVar13;
  bool forceNoSimplifier;
  Status SVar14;
  int iVar15;
  byte bVar16;
  int iVar17;
  undefined7 in_register_00000009;
  Verbosity old_verbosity_1;
  EVP_PKEY_CTX *ctx;
  Verbosity old_verbosity;
  uint uVar18;
  SolRational *pSVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  longdouble lVar23;
  bool maximizing;
  bool factorSolNewBasis;
  bool continueAfter;
  bool breakAfter;
  SPxSolverBase<double> *local_4f0;
  SolRational *local_4e8;
  int numCorrectedPrimals;
  undefined4 uStack_4dc;
  int local_4d8;
  int minIRRoundsRemaining_local;
  int maxDimRational;
  int numFailedRefinements;
  int primalSize;
  undefined4 uStack_4c4;
  undefined2 uStack_4c0;
  undefined6 uStack_4be;
  uint local_4b8;
  undefined2 local_4b4;
  bool local_4b2;
  data_type local_4a8;
  uint local_498;
  undefined2 local_494;
  bool local_492;
  VectorBase<double> dualReal;
  int nextRatrecRefinement;
  int dualSize;
  VectorBase<double> primalReal;
  Rational primalScale;
  Rational dualScale;
  Rational dualViolation;
  Rational sideViolation;
  Rational boundsViolation;
  Rational maxViolation;
  Rational maxScale;
  Rational redCostViolation;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_180;
  SLUFactorRational *local_178;
  VectorRational *local_170;
  Rational errorCorrectionFactor;
  Rational errorCorrection;
  Rational violationImprovementFactor;
  Rational bestViolation;
  VarStatus *local_58;
  undefined8 local_50;
  undefined8 local_48;
  VarStatus *local_40;
  undefined8 local_38;
  
  local_4f0 = (SPxSolverBase<double> *)
              CONCAT44(local_4f0._4_4_,(int)CONCAT71(in_register_00000009,acceptInfeasible));
  local_4e8 = sol;
  minIRRoundsRemaining_local = minIRRoundsRemaining;
  (*this->_statistics->rationalTime->_vptr_Timer[3])();
  *primalFeasible = false;
  *dualFeasible = false;
  *infeasible = false;
  *unbounded = false;
  *stoppedTime = false;
  *stoppedIter = false;
  *error = false;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&(this->_modLower).val,
           (long)(this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&(this->_modUpper).val,
           (long)(this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&(this->_modLhs).val,
           (long)(this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&(this->_modRhs).val,
           (long)(this->_rationalLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  local_170 = &this->_modObj;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&local_170->val,
           (long)(this->_rationalLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  VectorBase<double>::VectorBase
            (&primalReal,
             (this->_rationalLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .set.thenum);
  VectorBase<double>::VectorBase
            (&dualReal,
             (this->_rationalLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .set.thenum);
  boundsViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  boundsViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  boundsViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  boundsViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  boundsViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  boundsViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  boundsViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  boundsViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  boundsViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  boundsViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  sideViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  sideViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  sideViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  sideViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  sideViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  sideViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  sideViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  sideViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  sideViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  sideViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  redCostViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  redCostViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  redCostViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  redCostViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  redCostViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  redCostViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  redCostViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  redCostViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  redCostViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  redCostViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  dualViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  dualViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  dualViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  dualViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  dualViolation.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  dualViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  dualViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  dualViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  dualViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  dualViolation.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  primalScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  primalScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  primalScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  primalScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  primalScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  primalScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  primalScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  primalScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  primalScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  primalScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  dualScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  dualScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  dualScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  dualScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  dualScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  dualScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  dualScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  dualScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  dualScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  dualScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  maxScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  maxScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  maxScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  maxScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  maxScale.m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  maxScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  maxScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  maxScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  maxScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  maxScale.m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Initial floating-point solve . . .\n",0x23);
    (this->spxout).m_verbosity = VVar2;
  }
  pSVar19 = local_4e8;
  if (this->_hasBasis == true) {
    SPxSolverBase<double>::setBasis
              (&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    this->_hasBasis = NO_PROBLEM < (this->_solver).super_SPxBasisBase<double>.thestatus;
  }
  (*this->_statistics->rationalTime->_vptr_Timer[4])();
  basisStatusRows = &this->_basisStatusRows;
  basisStatusCols = &this->_basisStatusCols;
  bVar10 = local_4f0._0_1_;
  if (this->_currentSettings->_boolParamValues[0x19] == false) {
    SVar14 = _solveRealForRational(this,false,&primalReal,&dualReal,basisStatusRows,basisStatusCols)
    ;
  }
  else {
    SVar14 = _solveRealStable(this,acceptUnbounded,local_4f0._0_1_,&primalReal,&dualReal,
                              basisStatusRows,basisStatusCols,false);
  }
  local_4f0 = &this->_solver;
  bVar13 = _evaluateResult<double>
                     (this,local_4f0,SVar14,false,pSVar19,&dualReal,infeasible,unbounded,stoppedTime
                      ,stoppedIter,error);
  if (!bVar13) {
    (*this->_statistics->rationalTime->_vptr_Timer[3])();
    dualSize = 0;
    _storeRealSolutionAsRational<double>(this,pSVar19,&primalReal,&dualReal,&dualSize);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&primalScale,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&this->_rationalPosone);
    o = &(this->_rationalPosone).m_backend.m_value.den;
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&primalScale.m_backend.m_value.den,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)o);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&dualScale,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&this->_rationalPosone);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&dualScale.m_backend.m_value.den,
             (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)o);
    maxViolation.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    maxViolation.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    maxViolation.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    maxViolation.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    maxViolation.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    maxViolation.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 1;
    maxViolation.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    maxViolation.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    maxViolation.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    maxViolation.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor(&bestViolation.m_backend,&(this->_rationalPosInfty).m_backend);
    primalSize = 0x10;
    uStack_4c4 = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              (&violationImprovementFactor.m_backend,(longlong *)&primalSize,(type *)0x0);
    errorCorrectionFactor.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    errorCorrectionFactor.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    errorCorrectionFactor.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    errorCorrectionFactor.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    errorCorrectionFactor.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    errorCorrectionFactor.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 1;
    errorCorrectionFactor.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    errorCorrectionFactor.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    errorCorrectionFactor.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    errorCorrectionFactor.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)&errorCorrectionFactor,(longdouble)1.1);
    primalSize = 2;
    uStack_4c4 = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>(&errorCorrection.m_backend,(longlong *)&primalSize,(type *)0x0);
    numFailedRefinements = 0;
    local_40 = (VarStatus *)0x0;
    local_38 = 0x3ff3333333333333;
    local_48 = 0x100000000;
    spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&local_40,1);
    local_58 = (VarStatus *)0x0;
    local_50 = 0x3ff3333333333333;
    spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&local_58,1);
    maximizing = this->_currentSettings->_intParamValues[0] == 1;
    maxDimRational =
         (this->_rationalLP->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         .set.thenum;
    iVar15 = (this->_rationalLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .set.thenum;
    if (maxDimRational < iVar15) {
      maxDimRational = iVar15;
    }
    factorSolNewBasis = true;
    local_4d8 = 0;
    nextRatrecRefinement = 0;
    vec = &local_4e8->_redCost;
    local_178 = &this->_rationalLUSolver;
    pVVar1 = &local_4e8->_slacks;
    local_180 = &(this->_primalDualDiff).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ;
    lVar23 = (longdouble)1e+20;
    pSVar19 = local_4e8;
    while( true ) {
      minIRRoundsRemaining_local = minIRRoundsRemaining_local + -1;
      _computeBoundsViolation(this,pSVar19,&boundsViolation);
      _computeSidesViolation(this,pSVar19,&sideViolation);
      _computeReducedCostViolation(this,pSVar19,&redCostViolation,&maximizing);
      _computeDualViolation(this,pSVar19,&dualViolation,&maximizing);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=(local_170,vec);
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Max. bound violation = ",0x17);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::str_abi_cxx11_(&local_1a0,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                          *)&boundsViolation,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],local_1a0._M_dataplus._M_p,
                   local_1a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],", ofm = 1e",10);
        iVar15 = orderOfMagnitude(&boundsViolation);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"Max. row violation = ",0x15
                  );
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::str_abi_cxx11_(&local_1c0,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                          *)&sideViolation,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],local_1c0._M_dataplus._M_p,
                   local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],", ofm = 1e",10);
        iVar15 = orderOfMagnitude(&sideViolation);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],
                   "Max. reduced cost violation = ",0x1e);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::str_abi_cxx11_(&local_1e0,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                          *)&redCostViolation,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],local_1e0._M_dataplus._M_p,
                   local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],", ofm = 1e",10);
        iVar15 = orderOfMagnitude(&redCostViolation);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"Max. dual violation = ",
                   0x16);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::str_abi_cxx11_(&local_200,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                          *)&dualViolation,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],local_200._M_dataplus._M_p,
                   local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],", ofm = 1e",10);
        iVar15 = orderOfMagnitude(&dualViolation);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        (this->spxout).m_verbosity = VVar2;
      }
      (*this->_statistics->solvingTime->_vptr_Timer[6])();
      (*this->_statistics->rationalTime->_vptr_Timer[6])();
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::compare(&boundsViolation.m_backend,&sideViolation.m_backend);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)&redCostViolation,&dualViolation.m_backend);
      bVar13 = _isRefinementOver(this,primalFeasible,dualFeasible,&boundsViolation,&sideViolation,
                                 &redCostViolation,&dualViolation,minIRRoundsRemaining_local,
                                 stoppedTime,stoppedIter,numFailedRefinements);
      if (bVar13) break;
      _checkRefinementProgress
                (this,&boundsViolation,&sideViolation,&redCostViolation,&dualViolation,&maxViolation
                 ,&bestViolation,&violationImprovementFactor,&numFailedRefinements);
      _ratrecAndOrRatfac(this,&minIRRoundsRemaining_local,&local_4d8,&this->_statistics->refinements
                         ,&factorSolNewBasis,&nextRatrecRefinement,&errorCorrectionFactor,
                         &errorCorrection,&maxViolation,pSVar19,primalFeasible,dualFeasible,
                         stoppedTime,stoppedIter,error,&breakAfter,&continueAfter);
      if (breakAfter != false) break;
      if (continueAfter == false) {
        _computePrimalScalingFactor
                  (this,&maxScale,&primalScale,&boundsViolation,&sideViolation,&redCostViolation);
        _applyScaledBounds<double>(this,local_4f0,&primalScale);
        _applyScaledSides<double>(this,local_4f0,&primalScale);
        _computeDualScalingFactor
                  (this,&maxScale,&primalScale,&dualScale,&redCostViolation,&dualViolation);
        _applyScaledObj<double>(this,local_4f0,&dualScale,pSVar19);
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Refined floating-point solve . . .\n",0x23);
          (this->spxout).m_verbosity = VVar2;
        }
        iVar15 = (this->_slackCols).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum;
        bVar16 = this->_hasBasis;
        if ((0 < iVar15) && ((bVar16 & 1) != 0)) {
          iVar17 = (this->_rationalLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thenum - iVar15;
          lVar21 = 0;
          do {
            iVar3 = ((this->_slackCols).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .set.theitem
                     [(this->_slackCols).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      .set.thekey[lVar21].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .m_elem)->idx;
            pVVar4 = (this->_basisStatusRows).data;
            if (pVVar4[iVar3] == BASIC) {
              ctx = (EVP_PKEY_CTX *)((this->_basisStatusCols).data + iVar17);
              if (*(VarStatus *)(ctx + lVar21 * 4) != BASIC) {
                pVVar4[iVar3] = *(VarStatus *)(ctx + lVar21 * 4);
                *(undefined4 *)(ctx + lVar21 * 4) = 4;
                if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
                  SLUFactorRational::init(local_178,ctx);
                  iVar15 = (this->_slackCols).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           .set.thenum;
                }
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < iVar15);
          bVar16 = this->_hasBasis;
          pSVar19 = local_4e8;
        }
        if (((bVar16 & 1) != 0) && ((this->_solver).super_SPxBasisBase<double>.thestatus < REGULAR))
        {
          SPxSolverBase<double>::setBasis
                    (local_4f0,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
          this->_hasBasis = NO_PROBLEM < (this->_solver).super_SPxBasisBase<double>.thestatus;
        }
        iVar15 = this->_statistics->iterations;
        (*this->_statistics->rationalTime->_vptr_Timer[4])();
        uStack_4c0 = (undefined2)((unkuint10)lVar23 >> 0x40);
        uVar12 = uStack_4c0;
        primalSize = SUB104(lVar23,0);
        iVar17 = primalSize;
        uStack_4c4 = (undefined4)((unkuint10)lVar23 >> 0x20);
        uVar11 = uStack_4c4;
        if (this->_currentSettings->_boolParamValues[0x19] == false) {
          iVar3 = this->_currentSettings->_intParamValues[10];
          bVar13 = boost::multiprecision::default_ops::
                   eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                             (&primalScale.m_backend,(longdouble *)&primalSize,
                              (true_ *)&numCorrectedPrimals);
          if (bVar13) {
            if (DAT_006aa558 < 1) {
LAB_0031cf12:
              if (-1 < DAT_006aa5c8) {
                this->_boostedSimplifier =
                     (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x0;
                this->_simplifier = (SPxSimplifier<double> *)0x0;
                this->_currentSettings->_intParamValues[10] = 0;
              }
            }
          }
          else {
            primalSize = iVar17;
            uStack_4c4 = uVar11;
            uStack_4c0 = uVar12;
            bVar13 = boost::multiprecision::default_ops::
                     eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                               (&dualScale.m_backend,(longdouble *)&primalSize,
                                (true_ *)&numCorrectedPrimals);
            if (bVar13 && DAT_006aa558 < 1) goto LAB_0031cf12;
          }
          SVar14 = _solveRealForRational
                             (this,false,&primalReal,&dualReal,basisStatusRows,basisStatusCols);
          setIntParam(this,SIMPLIFIER,iVar3,true);
        }
        else {
          bVar13 = boost::multiprecision::default_ops::
                   eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                             (&primalScale.m_backend,(longdouble *)&primalSize,
                              (true_ *)&numCorrectedPrimals);
          forceNoSimplifier = true;
          if (!bVar13) {
            primalSize = iVar17;
            uStack_4c4 = uVar11;
            uStack_4c0 = uVar12;
            forceNoSimplifier =
                 boost::multiprecision::default_ops::
                 eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                           (&dualScale.m_backend,(longdouble *)&primalSize,
                            (true_ *)&numCorrectedPrimals);
          }
          SVar14 = _solveRealStable(this,acceptUnbounded,bVar10,&primalReal,&dualReal,
                                    basisStatusRows,basisStatusCols,forceNoSimplifier);
        }
        pSVar5 = this->_statistics;
        iVar17 = pSVar5->refinements + 1;
        pSVar5->refinements = iVar17;
        if (iVar15 < pSVar5->iterations) {
          factorSolNewBasis = true;
          pSVar5->pivotRefinements = iVar17;
          local_4d8 = 0;
        }
        else {
          local_4d8 = local_4d8 + 1;
          pSVar5->stallRefinements = pSVar5->stallRefinements + 1;
        }
        bVar13 = _evaluateResult<double>
                           (this,local_4f0,SVar14,true,pSVar19,&dualReal,infeasible,unbounded,
                            stoppedTime,stoppedIter,error);
        if (bVar13) goto LAB_0031d37f;
        (*this->_statistics->rationalTime->_vptr_Timer[3])();
        _correctPrimalSolution<double>
                  (this,pSVar19,&primalScale,&primalSize,&maxDimRational,&primalReal);
        pSVar6 = this->_rationalLP;
        pp_Var7 = (pSVar6->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._vptr_ClassArray;
        if ((this->_primalDualDiff).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .memused < primalSize) {
          (*pp_Var7[0x47])(pSVar6,local_180,pVVar1);
        }
        else {
          (*pp_Var7[0x46])(pSVar6,pSVar19,pVVar1,1);
        }
        _numCorrectedPrimals =
             CONCAT44(uStack_4dc,
                      (this->_primalDualDiff).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      .memused);
        _correctDualSolution<double>
                  (this,local_4f0,pSVar19,&maximizing,&dualReal,&dualScale,&dualSize,&maxDimRational
                  );
        _updateReducedCosts(this,pSVar19,&dualSize,&numCorrectedPrimals);
      }
    }
    if ((this->_hasBasis == true) &&
       (lVar21 = (long)(this->_rationalLP->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       .set.thenum, 0 < lVar21)) {
      uVar22 = lVar21 + 1;
      lVar21 = lVar21 << 6;
      do {
        bVar10 = maximizing;
        if (((this->_rowTypes).data[uVar22 - 2] != RANGETYPE_FIXED) &&
           ((this->_basisStatusRows).data[uVar22 - 2] == FIXED)) {
          pnVar8 = (local_4e8->_dual).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _numCorrectedPrimals = 0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&primalSize,(longlong *)&numCorrectedPrimals,(type *)0x0);
          iVar15 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&pnVar8[-1].m_backend.m_value.num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar21),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&primalSize);
          if ((local_494._1_1_ == false) && (local_492 == false)) {
            operator_delete(local_4a8.ld.data,(local_4a8.la[0] & 0xffffffff) << 3);
          }
          if ((local_4b4._1_1_ == false) && (local_4b2 == false)) {
            operator_delete((void *)CONCAT62(uStack_4be,uStack_4c0),(ulong)(uint)primalSize << 3);
          }
          (this->_basisStatusRows).data[uVar22 - 2] =
               (uint)(bVar10 == SUB41((uint)iVar15 >> 0x1f,0));
        }
        uVar22 = uVar22 - 1;
        lVar21 = lVar21 + -0x40;
      } while (1 < uVar22);
    }
    pSVar19 = local_4e8;
    if ((local_4e8->field_0xd0 & 1) != 0) {
      pnVar8 = (local_4e8->_primal).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((int)((ulong)((long)(local_4e8->_primal).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar8) >> 6) < 1)
         || (pSVar6 = this->_rationalLP,
            (int)((ulong)((long)(pSVar6->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                ).object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar6->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               ).object.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6) < 1)) {
        primalSize = 0;
        uStack_4c4 = 0;
        local_4b8 = 1;
        local_4b4._0_1_ = false;
        local_4b4._1_1_ = true;
        local_4b2 = false;
        local_4a8.la[0] = 1;
        local_498 = 1;
        local_494._0_1_ = false;
        local_494._1_1_ = true;
        local_492 = false;
      }
      else {
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&primalSize,&pnVar8->m_backend);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&primalSize,
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)(pSVar6->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        uVar18 = (uint)((ulong)((long)(pSVar19->_primal).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar19->_primal).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6);
        if (1 < (int)uVar18) {
          lVar20 = (ulong)(uVar18 & 0x7fffffff) - 1;
          lVar21 = 0x40;
          do {
            boost::multiprecision::default_ops::
            eval_multiply_add<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&primalSize,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)((long)&(((local_4e8->_primal).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.
                                  num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar21),
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)((long)&(((pSVar6->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.
                                  num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + lVar21));
            lVar21 = lVar21 + 0x40;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
        }
      }
      pSVar19 = local_4e8;
      this_00 = &local_4e8->_objVal;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)this_00,
                  (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)&primalSize);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)&(pSVar19->_objVal).m_backend.m_value.den,
                  (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)&local_4a8.ld);
      if ((local_494._1_1_ == false) && (local_492 == false)) {
        operator_delete(local_4a8.ld.data,(local_4a8.la[0] & 0xffffffff) << 3);
      }
      if ((local_4b4._1_1_ == false) && (local_4b2 == false)) {
        operator_delete((void *)CONCAT62(uStack_4be,uStack_4c0),(ulong)(uint)primalSize << 3);
      }
      if (this->_currentSettings->_intParamValues[0] == -1) {
        primalSize = -1;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                      *)this_00,&primalSize);
      }
    }
    __s = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    pdVar9 = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (__s != pdVar9) {
      memset(__s,0,(long)pdVar9 - (long)__s & 0xfffffffffffffff8);
    }
    (*(local_4f0->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
    (*this->_statistics->rationalTime->_vptr_Timer[4])();
LAB_0031d37f:
    if (local_58 != (VarStatus *)0x0) {
      free(local_58);
    }
    if (local_40 != (VarStatus *)0x0) {
      free(local_40);
    }
    if ((errorCorrection.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (errorCorrection.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(errorCorrection.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)errorCorrection.m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((errorCorrection.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (errorCorrection.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(errorCorrection.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)errorCorrection.m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((errorCorrectionFactor.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (errorCorrectionFactor.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(errorCorrectionFactor.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (errorCorrectionFactor.m_backend.m_value.den.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] & 0xffffffff) << 3);
    }
    if ((errorCorrectionFactor.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (errorCorrectionFactor.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(errorCorrectionFactor.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (errorCorrectionFactor.m_backend.m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] & 0xffffffff) << 3);
    }
    if ((violationImprovementFactor.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (violationImprovementFactor.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(violationImprovementFactor.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)violationImprovementFactor.m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((violationImprovementFactor.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (violationImprovementFactor.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(violationImprovementFactor.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)violationImprovementFactor.m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((bestViolation.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (bestViolation.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(bestViolation.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)bestViolation.m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((bestViolation.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (bestViolation.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(bestViolation.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)bestViolation.m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((maxViolation.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (maxViolation.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(maxViolation.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (maxViolation.m_backend.m_value.den.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] & 0xffffffff) << 3);
    }
    if ((maxViolation.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (maxViolation.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(maxViolation.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (maxViolation.m_backend.m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_data.la[0] & 0xffffffff) << 3);
    }
  }
  if ((maxScale.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (maxScale.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(maxScale.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (maxScale.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((maxScale.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (maxScale.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(maxScale.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (maxScale.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((dualScale.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (dualScale.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(dualScale.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (dualScale.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((dualScale.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (dualScale.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(dualScale.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (dualScale.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((primalScale.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (primalScale.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(primalScale.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (primalScale.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((primalScale.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (primalScale.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(primalScale.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (primalScale.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((dualViolation.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (dualViolation.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(dualViolation.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (dualViolation.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((dualViolation.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (dualViolation.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(dualViolation.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (dualViolation.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((redCostViolation.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (redCostViolation.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(redCostViolation.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (redCostViolation.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((redCostViolation.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (redCostViolation.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(redCostViolation.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (redCostViolation.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((sideViolation.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (sideViolation.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(sideViolation.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (sideViolation.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((sideViolation.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (sideViolation.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(sideViolation.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (sideViolation.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((boundsViolation.m_backend.m_value.den.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (boundsViolation.m_backend.m_value.den.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(boundsViolation.m_backend.m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (boundsViolation.m_backend.m_value.den.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if ((boundsViolation.m_backend.m_value.num.m_backend.
       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
       .m_internal == false) &&
     (boundsViolation.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias == false)) {
    operator_delete(boundsViolation.m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data,
                    (boundsViolation.m_backend.m_value.num.m_backend.
                     super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     .m_data.la[0] & 0xffffffff) << 3);
  }
  if (dualReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dualReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dualReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dualReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (primalReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(primalReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)primalReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)primalReal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_performOptIRStable(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   assert(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT));

   // start rational solving timing
   _statistics->rationalTime->start();

   primalFeasible = false;
   dualFeasible = false;
   infeasible = false;
   unbounded = false;
   stoppedTime = false;
   stoppedIter = false;
   error = false;

   // declare vectors and variables
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   _modLower.reDim(numColsRational(), false);
   _modUpper.reDim(numColsRational(), false);
   _modLhs.reDim(numRowsRational(), false);
   _modRhs.reDim(numRowsRational(), false);
   _modObj.reDim(numColsRational(), false);

   VectorBase<R> primalReal(numColsRational());
   VectorBase<R> dualReal(numRowsRational());

   Rational boundsViolation;
   Rational sideViolation;
   Rational redCostViolation;
   Rational dualViolation;
   Rational primalScale;
   Rational dualScale;
   Rational maxScale;

   // solve original LP
   SPX_MSG_INFO1(spxout, spxout << "Initial floating-point solve . . .\n");

   if(_hasBasis)
   {
      assert(_basisStatusRows.size() == numRowsRational());
      assert(_basisStatusCols.size() == numColsRational());
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      assert(_solver.maxRowObj(r) == 0.0);
   }

   _statistics->rationalTime->stop();

   // determine if we should use the recovery mechanism pipeline in case of fails
   if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
   else
      result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                _basisStatusCols);

   // evalute result
   if(_evaluateResult<R>(_solver, result, false, sol, dualReal, infeasible, unbounded, stoppedTime,
                         stoppedIter,
                         error))
      return;

   _statistics->rationalTime->start();

   int dualSize = 0;

   // stores floating-point solution of original LP as current rational solution
   // ensure that solution vectors have right dimension; ensure that solution is aligned with basis
   _storeRealSolutionAsRational<R>(sol, primalReal, dualReal, dualSize);

   // initial scaling factors are one
   primalScale = _rationalPosone;
   dualScale = _rationalPosone;

   // control progress
   Rational maxViolation;
   Rational bestViolation = _rationalPosInfty;
   const Rational violationImprovementFactor = 16;
   const Rational errorCorrectionFactor = 1.1;
   Rational errorCorrection = 2;
   int numFailedRefinements = 0;

   // store basis status in case solving modified problem failed
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusRowsFirst;
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusColsFirst;

   // refinement loop
   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);
   const int maxDimRational = numColsRational() > numRowsRational() ? numColsRational() :
                              numRowsRational();
   bool factorSolNewBasis = true;
   int lastStallRefinements = 0;
   int nextRatrecRefinement = 0;

   // used in _ratrecAndOrRatfac to order a break or a continue outside of the function.
   bool breakAfter;
   bool continueAfter;

   do
   {
      // decrement minIRRoundsRemaining counter
      minIRRoundsRemaining--;

      SPxOut::debug(this, "Computing primal violations.\n");

      // computes violation of bounds
      _computeBoundsViolation(sol, boundsViolation);

      // computes violation of sides
      _computeSidesViolation(sol, sideViolation);

      SPxOut::debug(this, "Computing dual violations.\n");

      // compute reduced cost violation
      _computeReducedCostViolation(sol, redCostViolation, maximizing);

      // compute dual violation
      _computeDualViolation(sol, dualViolation, maximizing);

      _modObj = sol._redCost;

      // output violations; the reduced cost violations for artificially introduced slack columns are actually violations of the dual multipliers
      SPX_MSG_INFO1(spxout, spxout
                    << "Max. bound violation = " << boundsViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       boundsViolation) << "\n"
                    << "Max. row violation = " << sideViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       sideViolation) << "\n"
                    << "Max. reduced cost violation = " << redCostViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       redCostViolation) << "\n"
                    << "Max. dual violation = " << dualViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       dualViolation) << "\n");


      SPxOut::debug(this, "Progress table: {} & {} & {} & {} & {} & {}\n", _statistics->refinements,
                    _statistics->iterations, _statistics->solvingTime->time(), _statistics->rationalTime->time(),
                    boundsViolation > sideViolation ? boundsViolation : sideViolation,
                    redCostViolation > dualViolation ? redCostViolation : dualViolation);

      // check termination criteria for refinement loop
      if(_isRefinementOver(primalFeasible, dualFeasible, boundsViolation, sideViolation, redCostViolation,
                           dualViolation,
                           minIRRoundsRemaining, stoppedTime, stoppedIter, numFailedRefinements))
         break;

      // check refinement progress
      _checkRefinementProgress(boundsViolation, sideViolation, redCostViolation, dualViolation,
                               maxViolation, bestViolation, violationImprovementFactor, numFailedRefinements);

      // perform rational reconstruction and/or factorization
      _ratrecAndOrRatfac(minIRRoundsRemaining, lastStallRefinements, _statistics->refinements,
                         factorSolNewBasis,
                         nextRatrecRefinement,
                         errorCorrectionFactor, errorCorrection, maxViolation,
                         sol, primalFeasible, dualFeasible,
                         stoppedTime, stoppedIter, error, breakAfter, continueAfter);

      if(breakAfter)
         break;
      else if(continueAfter)
         continue;

      // start refinement

      // compute primal scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computePrimalScalingFactor(maxScale, primalScale, boundsViolation, sideViolation,
                                  redCostViolation);

      // apply scaled bounds and scaled sides
      _applyScaledBounds<R>(_solver, primalScale);
      _applyScaledSides<R>(_solver, primalScale);

      // compute dual scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computeDualScalingFactor(maxScale, primalScale, dualScale, redCostViolation, dualViolation);

      // apply scaled objective function
      _applyScaledObj<R>(_solver, dualScale, sol);

      SPX_MSG_INFO1(spxout, spxout << "Refined floating-point solve . . .\n");

      // ensure that artificial slack columns are basic and inequality constraints are nonbasic; otherwise we may end
      // up with dual violation on inequality constraints after removing the slack columns; do not change this in the
      // floating-point solver, though, because the solver may require its original basis to detect optimality
      if(_slackCols.num() > 0 && _hasBasis)
      {
         int numOrigCols = numColsRational() - _slackCols.num();
         assert(_slackCols.num() <= 0 || boolParam(SoPlexBase<R>::EQTRANS));

         for(int i = 0; i < _slackCols.num(); i++)
         {
            int row = _slackCols.colVector(i).index(0);
            int col = numOrigCols + i;

            assert(row >= 0);
            assert(row < numRowsRational());

            if(_basisStatusRows[row] == SPxSolverBase<R>::BASIC
                  && _basisStatusCols[col] != SPxSolverBase<R>::BASIC)
            {
               _basisStatusRows[row] = _basisStatusCols[col];
               _basisStatusCols[col] = SPxSolverBase<R>::BASIC;
               _rationalLUSolver.clear();
            }
         }
      }

      // load basis
      if(_hasBasis && _solver.basis().status() < SPxBasisBase<R>::REGULAR)
      {
         SPxOut::debug(this, "basis (status = {}) desc before set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         SPxOut::debug(this, "basis (status = {}) desc after set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _hasBasis = _solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM;
         SPxOut::debug(this, "setting basis in solver {} (3)\n", (_hasBasis ? "successful" : "failed"));
      }

      // solve modified problem
      int prevIterations = _statistics->iterations;
      _statistics->rationalTime->stop();

      // determine if recovery pipeline should be used
      if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      {
         // turn off simplifier if scaling factors are too high
         int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);

         if(primalScale > 1e20 || dualScale > 1e20)
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
         // reset simplifier param to previous value
         setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
      }
      else
         result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                   _basisStatusCols, primalScale > 1e20 || dualScale > 1e20);

      // count refinements and remember whether we moved to a new basis
      _statistics->refinements++;

      if(_statistics->iterations <= prevIterations)
      {
         lastStallRefinements++;
         _statistics->stallRefinements++;
      }
      else
      {
         factorSolNewBasis = true;
         lastStallRefinements = 0;
         _statistics->pivotRefinements = _statistics->refinements;
      }

      // evaluate result; if modified problem was not solved to optimality, stop refinement;
      if(_evaluateResult<R>(_solver, result, true, sol, dualReal, infeasible, unbounded, stoppedTime,
                            stoppedIter,
                            error))
         return;

      _statistics->rationalTime->start();

      int primalSize;

      // correct primal solution and align with basis
      _correctPrimalSolution<R>(sol, primalScale, primalSize, maxDimRational, primalReal);

      // update or recompute slacks depending on which looks faster
      _updateSlacks(sol, primalSize);

      const int numCorrectedPrimals = _primalDualDiff.size();

      // correct dual solution and align with basis
      _correctDualSolution<R>(_solver, sol, maximizing, dualReal, dualScale, dualSize, maxDimRational);

      // update or recompute reduced cost values depending on which looks faster
      // adding one to the length of the dual vector accounts for the objective function vector
      _updateReducedCosts(sol, dualSize, numCorrectedPrimals);
   }
   while(true);

   // correct basis status for restricted inequalities
   if(_hasBasis)
   {
      for(int r = numRowsRational() - 1; r >= 0; r--)
      {
         assert((lhsRational(r) == rhsRational(r)) == (_rowTypes[r] == RANGETYPE_FIXED));

         if(_rowTypes[r] != RANGETYPE_FIXED && _basisStatusRows[r] == SPxSolverBase<R>::FIXED)
            _basisStatusRows[r] = (maximizing == (sol._dual[r] < 0))
                                  ? SPxSolverBase<R>::ON_LOWER
                                  : SPxSolverBase<R>::ON_UPPER;
      }
   }

   // compute objective function values
   assert(sol._isPrimalFeasible == sol._isDualFeasible);

   if(sol._isPrimalFeasible)
   {
      sol._objVal = sol._primal * _rationalLP->maxObj();

      if(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE)
         sol._objVal *= -1;
   }

   // set objective coefficients for all rows to zero
   _solver.clearRowObjs();

   // stop rational solving time
   _statistics->rationalTime->stop();
}